

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  IfcElement *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                              super_IfcBuildingElement.super_IfcElement.super_IfcProduct.
                              super_IfcObject + -0x18);
  this_00 = (IfcElement *)
            ((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x0 + lVar2);
  plVar1 = (long *)(&(this->super_IfcReinforcingElement).field_0x178 + lVar2);
  plVar1[-0x2f] = 0x8c4918;
  plVar1[0xf] = 0x8c4a58;
  plVar1[-0x1e] = 0x8c4940;
  plVar1[-0x1c] = 0x8c4968;
  plVar1[-0x15] = 0x8c4990;
  plVar1[-0xf] = 0x8c49b8;
  plVar1[-8] = 0x8c49e0;
  plVar1[-6] = 0x8c4a08;
  plVar1[-4] = 0x8c4a30;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__008c46e0);
  operator_delete(this_00,0x208);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}